

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.c++
# Opt level: O2

Type __thiscall capnp::StructSchema::Field::getType(Field *this)

{
  Reader proto;
  anon_union_8_2_eba6ea51_for_Type_5 aVar1;
  uint location;
  uint64_t id;
  Type TVar2;
  Reader local_78;
  Reader local_48;
  
  local_78._reader.data = (this->proto)._reader.data;
  local_78._reader.pointers = (this->proto)._reader.pointers;
  local_78._reader.dataSize = (this->proto)._reader.dataSize;
  location = this->index | 0x1000000;
  if (0x4f < local_78._reader.dataSize) {
    if (*(short *)((long)local_78._reader.data + 8) == 1) {
      if (local_78._reader.dataSize < 0xc0) {
        id = 0;
      }
      else {
        id = *(uint64_t *)((long)local_78._reader.data + 0x10);
      }
      local_78._reader.segment = (SegmentReader *)Schema::getDependency((Schema *)this,id,location);
      aVar1 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asStruct((Schema *)&local_78);
      TVar2.field_4 =
           (anon_union_8_2_eba6ea51_for_Type_5)(anon_union_8_2_eba6ea51_for_Type_5)aVar1.schema;
      TVar2.baseType = STRUCT;
      TVar2.listDepth = '\0';
      TVar2.isImplicitParam = false;
      TVar2.field_3 = (anon_union_2_2_d12d5221_for_Type_3)0x0;
      TVar2._6_2_ = 0;
      return TVar2;
    }
    if (*(short *)((long)local_78._reader.data + 8) != 0) {
      kj::_::unreachable();
    }
  }
  local_78._reader.segment = (this->proto)._reader.segment;
  local_78._reader.capTable = (this->proto)._reader.capTable;
  local_78._reader.pointerCount = (this->proto)._reader.pointerCount;
  local_78._reader._38_2_ = *(undefined2 *)&(this->proto)._reader.field_0x26;
  local_78._reader.nestingLimit = (this->proto)._reader.nestingLimit;
  local_78._reader._44_4_ = *(undefined4 *)&(this->proto)._reader.field_0x2c;
  capnp::schema::Field::Slot::Reader::getType(&local_48,&local_78);
  proto._reader.capTable = local_48._reader.capTable;
  proto._reader.segment = local_48._reader.segment;
  proto._reader.data = local_48._reader.data;
  proto._reader.pointers = local_48._reader.pointers;
  proto._reader.dataSize = local_48._reader.dataSize;
  proto._reader.pointerCount = local_48._reader.pointerCount;
  proto._reader._38_2_ = local_48._reader._38_2_;
  proto._reader.nestingLimit = local_48._reader.nestingLimit;
  proto._reader._44_4_ = local_48._reader._44_4_;
  TVar2 = Schema::interpretType((Schema *)this,proto,location);
  return TVar2;
}

Assistant:

Type StructSchema::Field::getType() const {
  auto proto = getProto();
  uint location = _::RawBrandedSchema::makeDepLocation(_::RawBrandedSchema::DepKind::FIELD, index);

  switch (proto.which()) {
    case schema::Field::SLOT:
      return parent.interpretType(proto.getSlot().getType(), location);

    case schema::Field::GROUP:
      return parent.getDependency(proto.getGroup().getTypeId(), location).asStruct();
  }
  KJ_UNREACHABLE;
}